

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O3

void Abc_NodeSuperChoiceCollect2(Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume)

{
  uint *puVar1;
  long lVar2;
  
  if (0 < vLeaves->nSize) {
    lVar2 = 0;
    do {
      puVar1 = (uint *)((long)vLeaves->pArray[lVar2] + 0x14);
      *puVar1 = *puVar1 | 0x40;
      lVar2 = lVar2 + 1;
    } while (lVar2 < vLeaves->nSize);
  }
  vVolume->nSize = 0;
  Abc_NodeSuperChoiceCollect2_rec(pRoot,vVolume);
  if (0 < vLeaves->nSize) {
    lVar2 = 0;
    do {
      puVar1 = (uint *)((long)vLeaves->pArray[lVar2] + 0x14);
      *puVar1 = *puVar1 & 0xffffffbf;
      lVar2 = lVar2 + 1;
    } while (lVar2 < vLeaves->nSize);
  }
  if (0 < vVolume->nSize) {
    lVar2 = 0;
    do {
      puVar1 = (uint *)((long)vVolume->pArray[lVar2] + 0x14);
      *puVar1 = *puVar1 & 0xffffffbf;
      lVar2 = lVar2 + 1;
    } while (lVar2 < vVolume->nSize);
  }
  return;
}

Assistant:

void Abc_NodeSuperChoiceCollect2( Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkC = 1;
    Vec_PtrClear( vVolume );
    Abc_NodeSuperChoiceCollect2_rec( pRoot, vVolume );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkC = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vVolume, pObj, i )
        pObj->fMarkC = 0;
}